

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O3

bool __thiscall OpenMD::ZConstraintForceModifier::checkZConsState(ZConstraintForceModifier *this)

{
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *plVar1;
  size_t *psVar2;
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *__position;
  RealType RVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  _List_node_base *p_Var10;
  bool bVar11;
  uint i;
  long lVar12;
  _List_node_base *p_Var13;
  _Self __tmp_1;
  _List_node_base *p_Var14;
  _List_node_base *p_Var15;
  _Self __tmp;
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> newFixedZMols;
  Vector<double,_3U> result;
  Vector<double,_3U> result_1;
  Vector3d com;
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> newMovingZMols;
  Vector3d local_e8;
  Vector3d local_c8;
  _List_node_base *local_a8 [4];
  _List_node_base *local_88 [4];
  _List_node_base local_68;
  long local_58;
  list<OpenMD::ZconstraintMol,std::allocator<OpenMD::ZconstraintMol>> *local_50;
  double local_48 [2];
  _List_node_base *local_38;
  
  local_88[0] = (_List_node_base *)0x0;
  local_88[1] = (_List_node_base *)0x0;
  local_88[2] = (_List_node_base *)0x0;
  local_68._M_next = &local_68;
  bVar11 = false;
  local_58 = 0;
  plVar1 = &this->fixedZMols_;
  p_Var14 = (this->fixedZMols_).
            super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  local_68._M_prev = local_68._M_next;
  if (p_Var14 != (_List_node_base *)plVar1) {
    bVar11 = false;
    do {
      Molecule::getCom(&local_e8,(Molecule *)p_Var14[1]._M_next);
      local_88[2] = (_List_node_base *)local_e8.super_Vector<double,_3U>.data_[2];
      local_88[0] = (_List_node_base *)local_e8.super_Vector<double,_3U>.data_[0];
      local_88[1] = (_List_node_base *)local_e8.super_Vector<double,_3U>.data_[1];
      local_a8[0] = (_List_node_base *)0x0;
      local_a8[1] = (_List_node_base *)0x0;
      local_a8[2] = p_Var14[1]._M_prev;
      local_c8.super_Vector<double,_3U>.data_[0] = 0.0;
      local_c8.super_Vector<double,_3U>.data_[1] = 0.0;
      local_c8.super_Vector<double,_3U>.data_[2] = 0.0;
      lVar12 = 0;
      do {
        local_c8.super_Vector<double,_3U>.data_[lVar12] =
             (double)local_88[lVar12] - (double)local_a8[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      local_e8.super_Vector<double,_3U>.data_[2] = local_c8.super_Vector<double,_3U>.data_[2];
      local_e8.super_Vector<double,_3U>.data_[0] = local_c8.super_Vector<double,_3U>.data_[0];
      local_e8.super_Vector<double,_3U>.data_[1] = local_c8.super_Vector<double,_3U>.data_[1];
      Snapshot::wrapVector(this->currSnapshot_,&local_e8);
      if (ABS(local_e8.super_Vector<double,_3U>.data_[2]) < this->zconsTol_ ||
          ABS(local_e8.super_Vector<double,_3U>.data_[2]) == this->zconsTol_) {
        p_Var15 = p_Var14->_M_next;
      }
      else {
        if (this->usingZconsGap_ == true) {
          p_Var14[4]._M_prev = (_List_node_base *)this->infiniteTime;
        }
        p_Var15 = p_Var14->_M_next;
        p_Var13 = (_List_node_base *)operator_new(0x50);
        p_Var4 = p_Var14[1]._M_next;
        p_Var5 = p_Var14[1]._M_prev;
        p_Var6 = p_Var14[2]._M_next;
        p_Var7 = p_Var14[2]._M_prev;
        p_Var8 = p_Var14[3]._M_next;
        p_Var9 = p_Var14[3]._M_prev;
        p_Var10 = p_Var14[4]._M_prev;
        p_Var13[4]._M_next = p_Var14[4]._M_next;
        p_Var13[4]._M_prev = p_Var10;
        p_Var13[3]._M_next = p_Var8;
        p_Var13[3]._M_prev = p_Var9;
        p_Var13[2]._M_next = p_Var6;
        p_Var13[2]._M_prev = p_Var7;
        p_Var13[1]._M_next = p_Var4;
        p_Var13[1]._M_prev = p_Var5;
        std::__detail::_List_node_base::_M_hook(p_Var13);
        local_58 = local_58 + 1;
        psVar2 = &(this->fixedZMols_).
                  super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
                  _M_impl._M_node._M_size;
        *psVar2 = *psVar2 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var14,0x50);
        bVar11 = true;
      }
      p_Var14 = p_Var15;
    } while (p_Var15 != (_List_node_base *)plVar1);
  }
  local_e8.super_Vector<double,_3U>.data_[0] = (double)&local_e8;
  local_e8.super_Vector<double,_3U>.data_[2] = 0.0;
  __position = &this->movingZMols_;
  p_Var14 = (this->movingZMols_).
            super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  local_e8.super_Vector<double,_3U>.data_[1] = local_e8.super_Vector<double,_3U>.data_[0];
  local_50 = (list<OpenMD::ZconstraintMol,std::allocator<OpenMD::ZconstraintMol>> *)plVar1;
  if (p_Var14 != (_List_node_base *)__position) {
    do {
      Molecule::getCom(&local_c8,(Molecule *)p_Var14[1]._M_next);
      local_88[2] = (_List_node_base *)local_c8.super_Vector<double,_3U>.data_[2];
      local_88[0] = (_List_node_base *)local_c8.super_Vector<double,_3U>.data_[0];
      local_88[1] = (_List_node_base *)local_c8.super_Vector<double,_3U>.data_[1];
      local_48[0] = 0.0;
      local_48[1] = 0.0;
      local_38 = p_Var14[1]._M_prev;
      local_a8[0] = (_List_node_base *)0x0;
      local_a8[1] = (_List_node_base *)0x0;
      local_a8[2] = (_List_node_base *)0x0;
      lVar12 = 0;
      do {
        local_a8[lVar12] = (_List_node_base *)((double)local_88[lVar12] - local_48[lVar12]);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      local_c8.super_Vector<double,_3U>.data_[2] = (double)local_a8[2];
      local_c8.super_Vector<double,_3U>.data_[0] = (double)local_a8[0];
      local_c8.super_Vector<double,_3U>.data_[1] = (double)local_a8[1];
      Snapshot::wrapVector(this->currSnapshot_,&local_c8);
      if (ABS(local_c8.super_Vector<double,_3U>.data_[2]) <= this->zconsTol_) {
        if (this->usingZconsGap_ == true) {
          RVar3 = Snapshot::getTime(this->currSnapshot_);
          p_Var14[4]._M_prev = (_List_node_base *)(RVar3 + this->zconsFixingTime_);
        }
        p_Var15 = p_Var14->_M_next;
        p_Var13 = (_List_node_base *)operator_new(0x50);
        p_Var4 = p_Var14[1]._M_next;
        p_Var5 = p_Var14[1]._M_prev;
        p_Var6 = p_Var14[2]._M_next;
        p_Var7 = p_Var14[2]._M_prev;
        p_Var8 = p_Var14[3]._M_next;
        p_Var9 = p_Var14[3]._M_prev;
        p_Var10 = p_Var14[4]._M_prev;
        p_Var13[4]._M_next = p_Var14[4]._M_next;
        p_Var13[4]._M_prev = p_Var10;
        p_Var13[3]._M_next = p_Var8;
        p_Var13[3]._M_prev = p_Var9;
        p_Var13[2]._M_next = p_Var6;
        p_Var13[2]._M_prev = p_Var7;
        p_Var13[1]._M_next = p_Var4;
        p_Var13[1]._M_prev = p_Var5;
        std::__detail::_List_node_base::_M_hook(p_Var13);
        local_e8.super_Vector<double,_3U>.data_[2] =
             (double)((long)local_e8.super_Vector<double,_3U>.data_[2] + 1);
        psVar2 = &(this->movingZMols_).
                  super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
                  _M_impl._M_node._M_size;
        *psVar2 = *psVar2 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var14,0x50);
        bVar11 = true;
        p_Var14 = p_Var15;
      }
      else {
        p_Var14 = p_Var14->_M_next;
      }
    } while (p_Var14 != (_List_node_base *)__position);
  }
  std::__cxx11::list<OpenMD::ZconstraintMol,std::allocator<OpenMD::ZconstraintMol>>::
  insert<std::_List_iterator<OpenMD::ZconstraintMol>,void>
            (local_50,(const_iterator)local_50,
             (_List_iterator<OpenMD::ZconstraintMol>)local_e8.super_Vector<double,_3U>.data_[0],
             (_List_node_base *)&local_e8);
  std::__cxx11::list<OpenMD::ZconstraintMol,std::allocator<OpenMD::ZconstraintMol>>::
  insert<std::_List_iterator<OpenMD::ZconstraintMol>,void>
            ((list<OpenMD::ZconstraintMol,std::allocator<OpenMD::ZconstraintMol>> *)__position,
             (const_iterator)__position,(_List_iterator<OpenMD::ZconstraintMol>)local_68._M_next,
             &local_68);
  p_Var14 = (_List_node_base *)local_e8.super_Vector<double,_3U>.data_[0];
  while (p_Var15 = local_68._M_next, p_Var14 != (_List_node_base *)&local_e8) {
    p_Var15 = p_Var14->_M_next;
    operator_delete(p_Var14,0x50);
    p_Var14 = p_Var15;
  }
  while (p_Var15 != &local_68) {
    p_Var14 = p_Var15->_M_next;
    operator_delete(p_Var15,0x50);
    p_Var15 = p_Var14;
  }
  return bVar11;
}

Assistant:

bool ZConstraintForceModifier::checkZConsState() {
    Vector3d com;
    RealType diff;
    int changed = 0;

    std::list<ZconstraintMol>::iterator i;
    std::list<ZconstraintMol>::iterator j;

    std::list<ZconstraintMol> newMovingZMols;
    for (i = fixedZMols_.begin(); i != fixedZMols_.end();) {
      com        = i->mol->getCom();
      Vector3d d = com - Vector3d(0.0, 0.0, i->param.zTargetPos);
      currSnapshot_->wrapVector(d);

      RealType diff = fabs(d[whichDirection]);

      if (diff > zconsTol_) {
        if (usingZconsGap_) { i->endFixingTime = infiniteTime; }
        j = i++;
        newMovingZMols.push_back(*j);
        fixedZMols_.erase(j);
        changed = 1;
      } else {
        ++i;
      }
    }

    std::list<ZconstraintMol> newFixedZMols;
    for (i = movingZMols_.begin(); i != movingZMols_.end();) {
      com        = i->mol->getCom();
      Vector3d d = com - Vector3d(0.0, 0.0, i->param.zTargetPos);
      currSnapshot_->wrapVector(d);
      diff = fabs(d[whichDirection]);

      if (diff <= zconsTol_) {
        if (usingZconsGap_) {
          i->endFixingTime = currSnapshot_->getTime() + zconsFixingTime_;
        }
        // This moving zconstraint molecule is now fixed
        j = i++;
        newFixedZMols.push_back(*j);
        movingZMols_.erase(j);
        changed = 1;
      } else {
        ++i;
      }
    }

    // merge the lists
    fixedZMols_.insert(fixedZMols_.end(), newFixedZMols.begin(),
                       newFixedZMols.end());
    movingZMols_.insert(movingZMols_.end(), newMovingZMols.begin(),
                        newMovingZMols.end());

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &changed, 1, MPI_INT, MPI_SUM, MPI_COMM_WORLD);
#endif

    return (changed > 0);
  }